

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

bool LookupHelper<std::map<XOnlyPubKey,TaprootBuilder,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,TaprootBuilder>>>,XOnlyPubKey,TaprootBuilder>
               (map<XOnlyPubKey,_TaprootBuilder,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
                *map,XOnlyPubKey *key,TaprootBuilder *value)

{
  long lVar1;
  const_iterator cVar2;
  _Rb_tree_header *p_Var3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = std::
          _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
          ::find(&map->_M_t,key);
  p_Var3 = &(map->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var3) {
    TaprootBuilder::operator=(value,(TaprootBuilder *)(cVar2._M_node + 2));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Rb_tree_header *)cVar2._M_node != p_Var3;
  }
  __stack_chk_fail();
}

Assistant:

bool LookupHelper(const M& map, const K& key, V& value)
{
    auto it = map.find(key);
    if (it != map.end()) {
        value = it->second;
        return true;
    }
    return false;
}